

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagemap_unittest.cc
# Opt level: O3

void TestMap<TCMalloc_PageMap2<20>>(int limit,bool limit_is_below_the_overflow_boundary)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  size_t __i;
  AssertHelperData *pAVar4;
  long lVar5;
  Number i2;
  Leaf *pLVar6;
  char *pcVar7;
  AssertHelperData *n;
  AssertHelperData *pAVar8;
  undefined1 local_2090 [8];
  TCMalloc_PageMap2<20> map;
  AssertHelper local_78;
  bool local_69;
  internal iStack_68;
  bool limit_is_below_the_overflow_boundary_local;
  vector<long,_std::allocator<long>_> elements;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  AssertHelper local_38;
  
  local_69 = limit_is_below_the_overflow_boundary;
  printf("Running test with %d iterations...\n");
  map.root_[0x3ff] = (Leaf *)malloc;
  memset(local_2090,0,0x2000);
  n = (AssertHelperData *)(long)limit;
  map.allocator_ = (_func_void_ptr_size_t *)(ulong)(uint)limit;
  if (0 < limit) {
    pAVar4 = (AssertHelperData *)0x0;
    do {
      TCMalloc_PageMap2<20>::Ensure((TCMalloc_PageMap2<20> *)local_2090,(Number)pAVar4,1);
      pAVar8 = (AssertHelperData *)((long)&pAVar4->type + 1);
      uVar3 = (uint)pAVar4 & 0x3ff;
      map.root_[((ulong)pAVar4 >> 10) - 1]->values[uVar3] = pAVar8;
      if ((pAVar4 < (AssertHelperData *)0x100000) &&
         (map.root_[((ulong)pAVar4 >> 10) - 1] != (Leaf *)0x0)) {
        local_48._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             map.root_[((ulong)pAVar4 >> 10) - 1]->values[uVar3];
      }
      else {
        local_48._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      local_38.data_ = pAVar8;
      testing::internal::CmpHelperEQ<void*,void*>
                (&stack0xffffffffffffff98,"map.get(i)","(void*)(i+1)",&local_48._M_head_impl,
                 &local_38.data_);
      if (iStack_68 == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        if (elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_start == (pointer)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = (char *)*elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                   ,0x3b,pcVar7);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
        goto LAB_00109d53;
      }
      if (elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&elements,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start);
      }
      pAVar4 = pAVar8;
    } while (pAVar8 != n);
    if (0 < (int)map.allocator_) {
      pAVar4 = (AssertHelperData *)0x0;
      do {
        if ((pAVar4 < (AssertHelperData *)0x100000) &&
           (map.root_[((ulong)pAVar4 >> 10) - 1] != (Leaf *)0x0)) {
          local_48._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               map.root_[((ulong)pAVar4 >> 10) - 1]->values[(uint)pAVar4 & 0x3ff];
        }
        else {
          local_48._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        pAVar4 = (AssertHelperData *)((long)&pAVar4->type + 1);
        local_38.data_ = pAVar4;
        testing::internal::CmpHelperEQ<void*,void*>
                  (&stack0xffffffffffffff98,"map.get(i)","(void*)(i+1)",&local_48._M_head_impl,
                   &local_38.data_);
        if (iStack_68 == (internal)0x0) {
          testing::Message::Message((Message *)&local_48);
          if (elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start == (pointer)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = (char *)*elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                     ,0x3e,pcVar7);
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
          goto LAB_00109d53;
        }
        if (elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_start != (pointer)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&elements,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start);
        }
      } while (n != pAVar4);
      map.root_[0x3ff] = (Leaf *)malloc;
      memset((TCMalloc_PageMap2<20> *)local_2090,0,0x2000);
      TCMalloc_PageMap2<20>::Ensure((TCMalloc_PageMap2<20> *)local_2090,0,(size_t)n);
      if (0 < (int)map.allocator_) {
        pAVar4 = (AssertHelperData *)0x0;
        do {
          pAVar8 = (AssertHelperData *)((long)&pAVar4->type + 1);
          uVar3 = (uint)pAVar4 & 0x3ff;
          map.root_[((ulong)pAVar4 >> 10) - 1]->values[uVar3] = pAVar8;
          if ((pAVar4 < (AssertHelperData *)0x100000) &&
             (map.root_[((ulong)pAVar4 >> 10) - 1] != (Leaf *)0x0)) {
            local_48._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 map.root_[((ulong)pAVar4 >> 10) - 1]->values[uVar3];
          }
          else {
            local_48._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          local_38.data_ = pAVar8;
          testing::internal::CmpHelperEQ<void*,void*>
                    (&stack0xffffffffffffff98,"map.get(i)","(void*)(i+1)",&local_48._M_head_impl,
                     &local_38.data_);
          if (iStack_68 == (internal)0x0) {
            testing::Message::Message((Message *)&local_48);
            if (elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start == (pointer)0x0) {
              pcVar7 = "";
            }
            else {
              pcVar7 = (char *)*elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_38,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                       ,0x47,pcVar7);
            testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
            goto LAB_00109d53;
          }
          if (elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&elements,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start);
          }
          pAVar4 = pAVar8;
        } while (n != pAVar8);
        if (0 < (int)map.allocator_) {
          pAVar4 = (AssertHelperData *)0x0;
          do {
            if ((pAVar4 < (AssertHelperData *)0x100000) &&
               (map.root_[((ulong)pAVar4 >> 10) - 1] != (Leaf *)0x0)) {
              local_48._M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   map.root_[((ulong)pAVar4 >> 10) - 1]->values[(uint)pAVar4 & 0x3ff];
            }
            else {
              local_48._M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
            pAVar4 = (AssertHelperData *)((long)&pAVar4->type + 1);
            local_38.data_ = pAVar4;
            testing::internal::CmpHelperEQ<void*,void*>
                      (&stack0xffffffffffffff98,"map.get(i)","(void*)(i+1)",&local_48._M_head_impl,
                       &local_38.data_);
            if (iStack_68 == (internal)0x0) {
              testing::Message::Message((Message *)&local_48);
              if (elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start == (pointer)0x0) {
                pcVar7 = "";
              }
              else {
                pcVar7 = (char *)*elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_start;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_38,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                         ,0x4a,pcVar7);
              testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
LAB_00109d53:
              testing::internal::AssertHelper::~AssertHelper(&local_38);
              if (local_48._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_48._M_head_impl + 8))();
              }
              if (elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start == (pointer)0x0) {
                return;
              }
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&elements,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start);
              return;
            }
            if (elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&elements,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start);
            }
          } while (n != pAVar4);
        }
      }
      goto LAB_0010983b;
    }
  }
  map.root_[0x3ff] = (Leaf *)malloc;
  memset((TCMalloc_PageMap2<20> *)local_2090,0,0x2000);
  TCMalloc_PageMap2<20>::Ensure((TCMalloc_PageMap2<20> *)local_2090,0,(size_t)n);
LAB_0010983b:
  map.root_[0x3ff] = (Leaf *)malloc;
  memset((TCMalloc_PageMap2<20> *)local_2090,0,0x2000);
  bVar2 = TCMalloc_PageMap2<20>::Ensure
                    ((TCMalloc_PageMap2<20> *)local_2090,(Number)n,(long)((int)map.allocator_ + 1));
  local_48._M_head_impl._0_1_ = (internal)bVar2;
  testing::internal::CmpHelperEQ<bool,bool>
            (&stack0xffffffffffffff98,"map.Ensure(limit, limit+1)",
             "limit_is_below_the_overflow_boundary",(bool *)&local_48,&local_69);
  if (iStack_68 == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (char *)*elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
               ,0x51,pcVar7);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&elements,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start);
  }
  if (iStack_68 != (internal)0x0) {
    _iStack_68 = (long *)0x0;
    elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_2090 = (undefined1  [8])0x0;
    if (0 < (int)map.allocator_) {
      do {
        if (elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_start ==
            elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    ((vector<long,std::allocator<long>> *)&stack0xffffffffffffff98,
                     (iterator)
                     elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start,(long *)local_2090);
        }
        else {
          *elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_start = (long)local_2090;
          elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start = elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
        }
        local_2090 = (undefined1  [8])((long)(void **)local_2090 + 1);
      } while ((long)local_2090 < (long)n);
    }
    local_2090 = (undefined1  [8])0x2a;
    lVar5 = 1;
    pLVar6 = (Leaf *)0x2a;
    do {
      pLVar6 = (Leaf *)(ulong)(((uint)((ulong)pLVar6 >> 0x1e) ^ (uint)pLVar6) * 0x6c078965 +
                              (int)lVar5);
      map.root_[lVar5 + -1] = pLVar6;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x270);
    map.root_[0x26f] = (Leaf *)0x270;
    std::
    shuffle<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
              (_iStack_68,
               (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
               elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start,
               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)local_2090);
    map.root_[0x3ff] = (Leaf *)malloc;
    memset(local_2090,0,0x2000);
    if (0 < (int)map.allocator_) {
      pAVar4 = (AssertHelperData *)0x0;
      do {
        TCMalloc_PageMap2<20>::Ensure
                  ((TCMalloc_PageMap2<20> *)local_2090,_iStack_68[(long)pAVar4],1);
        uVar1 = _iStack_68[(long)pAVar4];
        map.root_[(uVar1 >> 10) - 1]->values[(uint)uVar1 & 0x3ff] = (void *)(uVar1 + 1);
        uVar1 = _iStack_68[(long)pAVar4];
        if ((uVar1 < 0x100000) && (map.root_[(uVar1 >> 10) - 1] != (Leaf *)0x0)) {
          local_38.data_ =
               (AssertHelperData *)map.root_[(uVar1 >> 10) - 1]->values[(uint)uVar1 & 0x3ff];
        }
        else {
          local_38.data_ = (AssertHelperData *)0x0;
        }
        local_78.data_ = (AssertHelperData *)(uVar1 + 1);
        testing::internal::CmpHelperEQ<void*,void*>
                  ((internal *)&local_48,"map.get(elements[i])","(void*)(elements[i]+1)",
                   &local_38.data_,&local_78.data_);
        if (local_48._M_head_impl._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_38);
          if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar7 = "";
          }
          else {
            pcVar7 = (local_40->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                     ,0x5d,pcVar7);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_38);
          goto LAB_00109ccd;
        }
        if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_40,local_40);
        }
        pAVar4 = (AssertHelperData *)((long)&pAVar4->type + 1);
      } while (n != pAVar4);
      if (0 < (int)map.allocator_) {
        pAVar4 = (AssertHelperData *)0x0;
LAB_00109b33:
        if ((pAVar4 < (AssertHelperData *)0x100000) &&
           (map.root_[((ulong)pAVar4 >> 10) - 1] != (Leaf *)0x0)) {
          local_38.data_ =
               (AssertHelperData *)
               map.root_[((ulong)pAVar4 >> 10) - 1]->values[(uint)pAVar4 & 0x3ff];
        }
        else {
          local_38.data_ = (AssertHelperData *)0x0;
        }
        pAVar4 = (AssertHelperData *)((long)&pAVar4->type + 1);
        local_78.data_ = pAVar4;
        testing::internal::CmpHelperEQ<void*,void*>
                  ((internal *)&local_48,"map.get(i)","(void*)(i+1)",&local_38.data_,&local_78.data_
                  );
        if (local_48._M_head_impl._0_1_ != (internal)0x0) goto code_r0x00109b8d;
        testing::Message::Message((Message *)&local_38);
        if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = (local_40->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/pagemap_unittest.cc"
                   ,0x60,pcVar7);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_38);
LAB_00109ccd:
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if (local_38.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_38.data_ + 8))();
        }
        if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_40,local_40);
        }
      }
    }
LAB_00109cf7:
    if (_iStack_68 != (long *)0x0) {
      operator_delete(_iStack_68,
                      (long)elements.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)_iStack_68);
    }
  }
  return;
code_r0x00109b8d:
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  if (n == pAVar4) goto LAB_00109cf7;
  goto LAB_00109b33;
}

Assistant:

void TestMap(int limit, bool limit_is_below_the_overflow_boundary) {
  printf("Running test with %d iterations...\n", limit);

  { // Test sequential ensure/assignment
    Type map(malloc);
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      map.Ensure(i, 1);
      map.set(i, (void*)(i+1));
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
  }

  { // Test bulk Ensure
    Type map(malloc);
    map.Ensure(0, limit);
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      map.set(i, (void*)(i+1));
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
  }

  // Test that we correctly notice overflow
  {
    Type map(malloc);
    ASSERT_EQ(map.Ensure(limit, limit+1), limit_is_below_the_overflow_boundary);
  }

  { // Test randomized accesses
    std::vector<intptr_t> elements;
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) elements.push_back(i);
    std::shuffle(elements.begin(), elements.end(), std::mt19937(42));

    Type map(malloc);
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      map.Ensure(elements[i], 1);
      map.set(elements[i], (void*)(elements[i]+1));
      ASSERT_EQ(map.get(elements[i]), (void*)(elements[i]+1));
    }
    for (intptr_t i = 0; i < static_cast<intptr_t>(limit); i++) {
      ASSERT_EQ(map.get(i), (void*)(i+1));
    }
  }
}